

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

bool __thiscall
flatbuffers::go::GoGenerator::NamespacePtrLess::operator()
          (NamespacePtrLess *this,Definition *a,Definition *b)

{
  size_t __n;
  int iVar1;
  byte extraout_var;
  ulong uVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pbVar6;
  ulong uVar7;
  
  pbVar3 = (a->defined_namespace->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(a->defined_namespace->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
  uVar2 = (long)uVar7 >> 5;
  pbVar6 = (b->defined_namespace->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(b->defined_namespace->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
  uVar5 = (long)uVar4 >> 5;
  if (uVar2 <= uVar5) {
    uVar5 = uVar2;
  }
  while( true ) {
    if (uVar5 == 0) {
      return uVar7 < uVar4;
    }
    __n = pbVar3->_M_string_length;
    if ((__n != pbVar6->_M_string_length) ||
       ((__n != 0 &&
        (iVar1 = bcmp((pbVar3->_M_dataplus)._M_p,(pbVar6->_M_dataplus)._M_p,__n), iVar1 != 0))))
    break;
    pbVar6 = pbVar6 + 1;
    pbVar3 = pbVar3 + 1;
    uVar5 = uVar5 - 1;
  }
  std::__cxx11::string::compare((string *)pbVar3);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool operator()(const Definition *a, const Definition *b) const {
      return *a->defined_namespace < *b->defined_namespace;
    }